

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compress_advanced
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_parameters params)

{
  size_t sVar1;
  
  sVar1 = ZSTD_checkCParams(params.cParams);
  if (sVar1 < 0xffffffffffffff89) {
    ZSTD_CCtxParams_init_internal(&cctx->simpleApiParams,&params,0);
    sVar1 = ZSTD_compress_advanced_internal
                      (cctx,dst,dstCapacity,src,srcSize,dict,dictSize,&cctx->simpleApiParams);
  }
  return sVar1;
}

Assistant:

size_t ZSTD_compress_advanced (ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict,size_t dictSize,
                               ZSTD_parameters params)
{
    DEBUGLOG(4, "ZSTD_compress_advanced");
    FORWARD_IF_ERROR(ZSTD_checkCParams(params.cParams), "");
    ZSTD_CCtxParams_init_internal(&cctx->simpleApiParams, &params, ZSTD_NO_CLEVEL);
    return ZSTD_compress_advanced_internal(cctx,
                                           dst, dstCapacity,
                                           src, srcSize,
                                           dict, dictSize,
                                           &cctx->simpleApiParams);
}